

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall
BufferedReader::setFileIterator(BufferedReader *this,FileNameIterator *itr,int readerID)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_48 [3];
  _Self local_30;
  iterator reader;
  lock_guard<std::mutex> lock;
  int readerID_local;
  FileNameIterator *itr_local;
  BufferedReader *this_local;
  
  lock._M_device._4_4_ = readerID;
  if (readerID == -1) {
    __assert_fail("readerID != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/bufferedReader.cpp"
                  ,299,"void BufferedReader::setFileIterator(FileNameIterator *, const int)");
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&reader,&this->m_readersMtx);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&lock._M_device + 4));
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::end(&this->m_readers);
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_30);
    ppVar2->second->itr = itr;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&reader);
  return;
}

Assistant:

void BufferedReader::setFileIterator(FileNameIterator* itr, const int readerID)
{
    assert(readerID != -1);
    std::lock_guard lock(m_readersMtx);
    const auto reader = m_readers.find(readerID);
    if (reader != m_readers.end())
        reader->second->itr = itr;
}